

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O1

void __thiscall TCV::visit(TCV *this,Call *node)

{
  pointer pcVar1;
  bool bVar2;
  ASTNode *this_00;
  string *psVar3;
  Variable *this_01;
  int *piVar4;
  string nodeName;
  string local_68 [2];
  
  this_00 = AST::ASTNode::getChild(&node->super_ASTNode,0);
  psVar3 = AST::ASTNode::getName_abi_cxx11_(this_00);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  local_68[0]._M_dataplus._M_p = (pointer)&local_68[0].field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar1,pcVar1 + psVar3->_M_string_length);
  bVar2 = isFuncCall(&node->super_ASTNode);
  if (bVar2) {
    handleChainCalls(this,local_68,&node->super_ASTNode);
  }
  else {
    bVar2 = isCalledOnObject(&node->super_ASTNode);
    if (!bVar2) {
      bVar2 = isCalledOnFunction(&node->super_ASTNode);
      if (!bVar2) {
        this_01 = getAvailableVar(this,local_68);
        bVar2 = isCalledWithDimension(&node->super_ASTNode);
        if (bVar2) {
          checkIfArrayCalledWithRightDimensions(this,this_01,local_68,&node->super_ASTNode);
        }
        else {
          Variable::getType_abi_cxx11_(this_01);
          std::__cxx11::string::_M_assign((string *)&this->returnType);
          piVar4 = AST::ASTNode::getLineNumber(this_00);
          this->position = *piVar4;
        }
        goto LAB_0012ef73;
      }
    }
    checkIfClassVariableCalledWithRightAccess(this,local_68,&node->super_ASTNode);
  }
LAB_0012ef73:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68[0]._M_dataplus._M_p != &local_68[0].field_2) {
    operator_delete(local_68[0]._M_dataplus._M_p,local_68[0].field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TCV::visit(Call *node) {
    auto _node = node->getChild(0);
    auto nodeName = _node->getName();

    try {
        if (isFuncCall(node)) {

            handleChainCalls(nodeName, node);
            return;
        } else {
            if (isCalledOnObject(node) || isCalledOnFunction(node)) {
                checkIfClassVariableCalledWithRightAccess(nodeName, node);
                return;
            }
        }

        const Variable *variable = getAvailableVar(nodeName);
        if (isCalledWithDimension(node)) {
            checkIfArrayCalledWithRightDimensions(variable, nodeName, node);
            return;
        }

        returnType = variable->getType();
        position = _node->getLineNumber();
    } catch (Semantic::Error &error) {
        detector->addError(error.what());
        return;
    }
}